

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::ClearCase::renderTo
          (ClearCase *this,Surface *dst,bool useBBox)

{
  float fVar1;
  float fVar2;
  float fVar3;
  code *pcVar4;
  int iVar5;
  int iVar6;
  deUint32 dVar7;
  deBool dVar8;
  RenderTarget *pRVar9;
  RenderContext *pRVar10;
  long lVar11;
  char *str;
  ShaderProgram *pSVar12;
  TestError *this_00;
  size_type sVar13;
  reference pvVar14;
  float *pfVar15;
  reference pvVar16;
  float *pfVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float local_220;
  float local_218;
  int local_210;
  int local_208;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  deUint32 local_190;
  PixelBufferAccess local_138;
  undefined1 local_110 [8];
  Vec4 color;
  int scissorH;
  int scissorW;
  int scissorY;
  int scissorX;
  int componentNdx;
  int vertexNdx;
  float local_e0 [2];
  Vector<float,_4> local_d8;
  undefined1 local_c8 [8];
  Vec4 bboxMax;
  Vec4 bboxMin;
  int objectVertexLength;
  int objectVertexStartNdx;
  int drawObjNdx;
  int opNdx;
  int positionAttribLoc;
  deUint32 programHandle;
  undefined1 local_78 [8];
  VertexArray vao;
  Random rnd;
  Functions *gl;
  IVec2 renderTargetSize;
  Vec4 green;
  Vec4 yellow;
  int numOps;
  bool useBBox_local;
  Surface *dst_local;
  ClearCase *this_local;
  undefined4 extraout_var;
  
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(green.m_data + 2),1.0,1.0,0.0,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&renderTargetSize,0.0,1.0,0.0,1.0);
  pRVar9 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar5 = tcu::RenderTarget::getWidth(pRVar9);
  pRVar9 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar6 = tcu::RenderTarget::getHeight(pRVar9);
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&gl,iVar5,iVar6);
  pRVar10 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar5 = (*pRVar10->_vptr_RenderContext[3])();
  lVar11 = CONCAT44(extraout_var,iVar5);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar7 = deStringHash(str);
  de::Random::Random((Random *)&vao.super_ObjectWrapper.m_object,dVar7);
  pRVar10 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)local_78,pRVar10);
  (**(code **)(lVar11 + 0x4e8))(0xc11);
  pcVar4 = *(code **)(lVar11 + 0x1a00);
  iVar5 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&gl);
  iVar6 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&gl);
  (*pcVar4)(0,0,iVar5,iVar6);
  pcVar4 = *(code **)(lVar11 + 0x1c0);
  pfVar15 = green.m_data + 2;
  fVar18 = tcu::Vector<float,_4>::x((Vector<float,_4> *)pfVar15);
  fVar19 = tcu::Vector<float,_4>::y((Vector<float,_4> *)pfVar15);
  fVar20 = tcu::Vector<float,_4>::z((Vector<float,_4> *)pfVar15);
  fVar21 = tcu::Vector<float,_4>::w((Vector<float,_4> *)pfVar15);
  (*pcVar4)(fVar18,fVar19,fVar20,fVar21);
  (**(code **)(lVar11 + 0x188))(0x4000);
  (**(code **)(lVar11 + 0x648))();
  if ((this->m_scissoredClear & 1U) != 0) {
    (**(code **)(lVar11 + 0x5e0))(0xc11);
  }
  if ((this->m_drawTriangles & 1U) != 0) {
    if (((this->m_useGlobalState & 1U) == 0) && (useBBox)) {
      pSVar12 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                ::operator->(&(this->m_perPrimitiveProgram).
                              super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                            );
      local_190 = glu::ShaderProgram::getProgram(pSVar12);
    }
    else {
      pSVar12 = de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                ::operator->(&(this->m_basicProgram).
                              super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                            );
      local_190 = glu::ShaderProgram::getProgram(pSVar12);
    }
    iVar5 = (**(code **)(lVar11 + 0x780))(local_190,"a_position");
    do {
      dVar8 = ::deGetFalse();
      if ((dVar8 != 0) || (iVar5 == -1)) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,(char *)0x0,"positionAttribLoc != -1",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                   ,0x1120);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      dVar8 = ::deGetFalse();
    } while (dVar8 != 0);
    (**(code **)(lVar11 + 0x1680))(local_190);
    pcVar4 = *(code **)(lVar11 + 0xd8);
    dVar7 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_78);
    (*pcVar4)(dVar7);
    (**(code **)(lVar11 + 0x610))(iVar5);
    (**(code **)(lVar11 + 0x19f0))(iVar5,4,0x1406,0,0x10,0);
    (**(code **)(lVar11 + 0xfd8))(0x8e72);
  }
  for (objectVertexStartNdx = 0; objectVertexStartNdx < 0x2d;
      objectVertexStartNdx = objectVertexStartNdx + 1) {
    if ((this->m_drawTriangles & 1U) == 0) {
      local_1b0 = 0;
    }
    else {
      sVar13 = std::
               vector<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
               ::size(&this->m_drawObjects);
      local_1b0 = de::Random::getInt((Random *)&vao.super_ObjectWrapper.m_object,0,(int)sVar13 + -1)
      ;
    }
    if ((this->m_drawTriangles & 1U) == 0) {
      local_1b4 = 0;
    }
    else {
      pvVar14 = std::
                vector<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
                ::operator[](&this->m_drawObjects,(long)local_1b0);
      local_1b4 = pvVar14->firstNdx;
    }
    if ((this->m_drawTriangles & 1U) == 0) {
      local_1b8 = 0;
    }
    else {
      pvVar14 = std::
                vector<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::ClearCase::DrawObject>_>
                ::operator[](&this->m_drawObjects,(long)local_1b0);
      local_1b8 = pvVar14->numVertices;
    }
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(bboxMax.m_data + 2));
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_c8);
    if ((this->m_drawTriangles & 1U) == 0) {
      fVar18 = de::Random::getFloat((Random *)&vao.super_ObjectWrapper.m_object,-1.2,1.0);
      pfVar15 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(bboxMax.m_data + 2));
      *pfVar15 = fVar18;
      fVar18 = de::Random::getFloat((Random *)&vao.super_ObjectWrapper.m_object,-1.2,1.0);
      pfVar15 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(bboxMax.m_data + 2));
      *pfVar15 = fVar18;
      fVar18 = de::Random::getFloat((Random *)&vao.super_ObjectWrapper.m_object,-1.2,1.0);
      pfVar15 = bboxMax.m_data + 2;
      pfVar17 = tcu::Vector<float,_4>::z((Vector<float,_4> *)pfVar15);
      *pfVar17 = fVar18;
      pfVar17 = tcu::Vector<float,_4>::w((Vector<float,_4> *)pfVar15);
      *pfVar17 = 1.0;
      pfVar15 = tcu::Vector<float,_4>::x((Vector<float,_4> *)pfVar15);
      fVar18 = *pfVar15;
      fVar19 = de::Random::getFloat((Random *)&vao.super_ObjectWrapper.m_object,0.2,1.0);
      pfVar15 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_c8);
      *pfVar15 = fVar18 + fVar19;
      pfVar15 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(bboxMax.m_data + 2));
      fVar18 = *pfVar15;
      fVar19 = de::Random::getFloat((Random *)&vao.super_ObjectWrapper.m_object,0.2,1.0);
      pfVar15 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_c8);
      *pfVar15 = fVar18 + fVar19;
      pfVar15 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(bboxMax.m_data + 2));
      fVar18 = *pfVar15;
      fVar19 = de::Random::getFloat((Random *)&vao.super_ObjectWrapper.m_object,0.2,1.0);
      pfVar15 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_c8);
      *pfVar15 = fVar18 + fVar19;
      pfVar15 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_c8);
      *pfVar15 = 1.0;
    }
    else {
      tcu::Vector<float,_4>::Vector(&local_d8,1.0,1.0,1.0,1.0);
      bboxMax.m_data[2] = local_d8.m_data[0];
      bboxMax.m_data[3] = local_d8.m_data[1];
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&componentNdx,-1.0,-1.0,-1.0,-1.0);
      local_c8._0_4_ = componentNdx;
      local_c8._4_4_ = vertexNdx;
      bboxMax.m_data[0] = local_e0[0];
      bboxMax.m_data[1] = local_e0[1];
      for (scissorX = local_1b4; scissorX < local_1b4 + local_1b8; scissorX = scissorX + 1) {
        for (scissorY = 0; scissorY < 4; scissorY = scissorY + 1) {
          pfVar15 = tcu::Vector<float,_4>::operator[]
                              ((Vector<float,_4> *)(bboxMax.m_data + 2),scissorY);
          fVar18 = *pfVar15;
          pvVar16 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                    operator[](&this->m_objectVertices,(long)scissorX);
          pfVar15 = tcu::Vector<float,_4>::operator[](pvVar16,scissorY);
          fVar18 = de::min<float>(fVar18,*pfVar15);
          pfVar15 = tcu::Vector<float,_4>::operator[]
                              ((Vector<float,_4> *)(bboxMax.m_data + 2),scissorY);
          *pfVar15 = fVar18;
          pfVar15 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_c8,scissorY);
          fVar18 = *pfVar15;
          pvVar16 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                    operator[](&this->m_objectVertices,(long)scissorX);
          pfVar15 = tcu::Vector<float,_4>::operator[](pvVar16,scissorY);
          fVar18 = de::max<float>(fVar18,*pfVar15);
          pfVar15 = tcu::Vector<float,_4>::operator[]((Vector<float,_4> *)local_c8,scissorY);
          *pfVar15 = fVar18;
        }
      }
    }
    if ((this->m_scissoredClear & 1U) != 0) {
      if ((this->m_fullscreenScissor & 1U) == 0) {
        iVar5 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&gl);
        local_208 = de::Random::getInt((Random *)&vao.super_ObjectWrapper.m_object,0,iVar5 + -1);
      }
      else {
        local_208 = 0;
      }
      if ((this->m_fullscreenScissor & 1U) == 0) {
        iVar5 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&gl);
        local_210 = de::Random::getInt((Random *)&vao.super_ObjectWrapper.m_object,0,iVar5 + -1);
      }
      else {
        local_210 = 0;
      }
      if ((this->m_fullscreenScissor & 1U) == 0) {
        iVar5 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&gl);
        local_218 = (float)de::Random::getInt((Random *)&vao.super_ObjectWrapper.m_object,0,
                                              iVar5 - local_208);
      }
      else {
        local_218 = (float)tcu::Vector<int,_2>::x((Vector<int,_2> *)&gl);
      }
      color.m_data[3] = local_218;
      if ((this->m_fullscreenScissor & 1U) == 0) {
        iVar5 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&gl);
        local_220 = (float)de::Random::getInt((Random *)&vao.super_ObjectWrapper.m_object,0,
                                              iVar5 - local_210);
      }
      else {
        local_220 = (float)tcu::Vector<int,_2>::y((Vector<int,_2> *)&gl);
      }
      color.m_data[2] = local_220;
      (**(code **)(lVar11 + 0x1290))(local_208,local_210,color.m_data[3],local_220);
    }
    fVar18 = de::Random::getFloat((Random *)&vao.super_ObjectWrapper.m_object);
    tcu::mix<4>((tcu *)local_110,(Vector<float,_4> *)&renderTargetSize,
                (Vector<float,_4> *)(green.m_data + 2),fVar18 * 0.4);
    pcVar4 = *(code **)(lVar11 + 0x1c0);
    fVar18 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_110);
    fVar19 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_110);
    fVar20 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_110);
    fVar21 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_110);
    (*pcVar4)(fVar18,fVar19,fVar20,fVar21);
    (**(code **)(lVar11 + 0x188))(0x4000);
    if ((useBBox) && ((this->m_useGlobalState & 1U) != 0)) {
      pcVar4 = *(code **)(lVar11 + 0x1040);
      pfVar15 = bboxMax.m_data + 2;
      pfVar17 = tcu::Vector<float,_4>::x((Vector<float,_4> *)pfVar15);
      fVar18 = *pfVar17;
      pfVar17 = tcu::Vector<float,_4>::y((Vector<float,_4> *)pfVar15);
      fVar19 = *pfVar17;
      pfVar17 = tcu::Vector<float,_4>::z((Vector<float,_4> *)pfVar15);
      fVar20 = *pfVar17;
      pfVar15 = tcu::Vector<float,_4>::w((Vector<float,_4> *)pfVar15);
      fVar21 = *pfVar15;
      pfVar15 = tcu::Vector<float,_4>::x((Vector<float,_4> *)local_c8);
      fVar1 = *pfVar15;
      pfVar15 = tcu::Vector<float,_4>::y((Vector<float,_4> *)local_c8);
      fVar2 = *pfVar15;
      pfVar15 = tcu::Vector<float,_4>::z((Vector<float,_4> *)local_c8);
      fVar3 = *pfVar15;
      pfVar15 = tcu::Vector<float,_4>::w((Vector<float,_4> *)local_c8);
      (*pcVar4)(fVar18,fVar19,fVar20,fVar21,fVar1,fVar2,fVar3,*pfVar15);
    }
    if ((this->m_drawTriangles & 1U) != 0) {
      (**(code **)(lVar11 + 0x538))(0xe,local_1b4,local_1b8);
    }
  }
  dVar7 = (**(code **)(lVar11 + 0x800))();
  glu::checkError(dVar7,"post draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                  ,0x1168);
  pRVar10 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess(&local_138,dst);
  glu::readPixels(pRVar10,0,0,&local_138);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)local_78);
  de::Random::~Random((Random *)&vao.super_ObjectWrapper.m_object);
  return;
}

Assistant:

void ClearCase::renderTo (tcu::Surface& dst, bool useBBox)
{
	const int				numOps				= 45;
	const tcu::Vec4			yellow				(1.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4			green				(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::IVec2		renderTargetSize	(m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight());
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	de::Random				rnd					(deStringHash(getName()));
	glu::VertexArray		vao					(m_context.getRenderContext());

	// always do the initial clear
	gl.disable(GL_SCISSOR_TEST);
	gl.viewport(0, 0, renderTargetSize.x(), renderTargetSize.y());
	gl.clearColor(yellow.x(), yellow.y(), yellow.z(), yellow.w());
	gl.clear(GL_COLOR_BUFFER_BIT);
	gl.finish();

	// prepare draw
	if (m_scissoredClear)
		gl.enable(GL_SCISSOR_TEST);

	if (m_drawTriangles)
	{
		const deUint32	programHandle		= (m_useGlobalState || !useBBox) ? (m_basicProgram->getProgram()) : (m_perPrimitiveProgram->getProgram());
		const int		positionAttribLoc	= gl.getAttribLocation(programHandle, "a_position");

		TCU_CHECK(positionAttribLoc != -1);

		gl.useProgram(programHandle);
		gl.bindVertexArray(*vao);
		gl.enableVertexAttribArray(positionAttribLoc);
		gl.vertexAttribPointer(positionAttribLoc, 4, GL_FLOAT, GL_FALSE, (int)sizeof(tcu::Vec4), DE_NULL);
		gl.patchParameteri(GL_PATCH_VERTICES, 3);
	}

	// do random scissor/clearldraw operations
	for (int opNdx = 0; opNdx < numOps; ++opNdx)
	{
		const int	drawObjNdx				= (m_drawTriangles) ? (rnd.getInt(0, (int)m_drawObjects.size() - 1)) : (0);
		const int	objectVertexStartNdx	= (m_drawTriangles) ? (m_drawObjects[drawObjNdx].firstNdx) : (0);
		const int	objectVertexLength		= (m_drawTriangles) ? (m_drawObjects[drawObjNdx].numVertices) : (0);
		tcu::Vec4	bboxMin;
		tcu::Vec4	bboxMax;

		if (m_drawTriangles)
		{
			bboxMin = tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f);
			bboxMax = tcu::Vec4(-1.0f, -1.0f, -1.0f, -1.0f);

			// calc bbox
			for (int vertexNdx = objectVertexStartNdx; vertexNdx < objectVertexStartNdx + objectVertexLength; ++vertexNdx)
			for (int componentNdx = 0; componentNdx < 4; ++componentNdx)
			{
				bboxMin[componentNdx] = de::min(bboxMin[componentNdx], m_objectVertices[vertexNdx][componentNdx]);
				bboxMax[componentNdx] = de::max(bboxMax[componentNdx], m_objectVertices[vertexNdx][componentNdx]);
			}
		}
		else
		{
			// no geometry, just random something
			bboxMin.x() = rnd.getFloat(-1.2f, 1.0f);
			bboxMin.y() = rnd.getFloat(-1.2f, 1.0f);
			bboxMin.z() = rnd.getFloat(-1.2f, 1.0f);
			bboxMin.w() = 1.0f;
			bboxMax.x() = bboxMin.x() + rnd.getFloat(0.2f, 1.0f);
			bboxMax.y() = bboxMin.y() + rnd.getFloat(0.2f, 1.0f);
			bboxMax.z() = bboxMin.z() + rnd.getFloat(0.2f, 1.0f);
			bboxMax.w() = 1.0f;
		}

		if (m_scissoredClear)
		{
			const int scissorX = (m_fullscreenScissor) ? (0)					: rnd.getInt(0, renderTargetSize.x()-1);
			const int scissorY = (m_fullscreenScissor) ? (0)					: rnd.getInt(0, renderTargetSize.y()-1);
			const int scissorW = (m_fullscreenScissor) ? (renderTargetSize.x())	: rnd.getInt(0, renderTargetSize.x()-scissorX);
			const int scissorH = (m_fullscreenScissor) ? (renderTargetSize.y())	: rnd.getInt(0, renderTargetSize.y()-scissorY);

			gl.scissor(scissorX, scissorY, scissorW, scissorH);
		}

		{
			const tcu::Vec4 color = tcu::mix(green, yellow, rnd.getFloat() * 0.4f); // greenish
			gl.clearColor(color.x(), color.y(), color.z(), color.w());
			gl.clear(GL_COLOR_BUFFER_BIT);
		}

		if (useBBox)
		{
			DE_ASSERT(m_useGlobalState || m_drawTriangles); // !m_useGlobalState -> m_drawTriangles
			if (m_useGlobalState)
				gl.primitiveBoundingBox(bboxMin.x(), bboxMin.y(), bboxMin.z(), bboxMin.w(),
										bboxMax.x(), bboxMax.y(), bboxMax.z(), bboxMax.w());
		}

		if (m_drawTriangles)
			gl.drawArrays(GL_PATCHES, objectVertexStartNdx, objectVertexLength);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "post draw");
	glu::readPixels(m_context.getRenderContext(), 0, 0, dst.getAccess());
}